

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gridtestTestHelpers.hpp
# Opt level: O3

bool testAccEval<float,GridMethodFast>
               (vector<double,_std::allocator<double>_> *x,
               vector<double,_std::allocator<double>_> *y,int numx,double tolerance,
               TasmanianSparseGrid *grid,string *message)

{
  pointer pdVar1;
  pointer pcVar2;
  bool bVar3;
  pointer pfVar4;
  float *pfVar5;
  ulong uVar6;
  long lVar7;
  size_type __n;
  long lVar8;
  allocator_type local_b1;
  float *local_b0;
  pointer local_a8;
  double local_a0;
  vector<float,_std::allocator<float>_> local_98;
  vector<double,_std::allocator<double>_> *local_80;
  double local_78;
  string *local_70;
  vector<float,_std::allocator<float>_> local_68;
  string local_50;
  
  local_98.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_98.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_98.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  if (*(long *)(grid + 8) == 0) {
    lVar7 = 0;
  }
  else {
    lVar7 = (long)*(int *)(*(long *)(grid + 8) + 0x10);
  }
  local_a0 = (double)(long)numx;
  __n = lVar7 * (long)local_a0;
  local_80 = y;
  local_78 = tolerance;
  local_70 = message;
  std::vector<float,_std::allocator<float>_>::vector(&local_68,__n,&local_b1);
  if (__n != 0) {
    pdVar1 = (x->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    lVar7 = 0;
    pfVar4 = local_68.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start;
    do {
      *pfVar4 = (float)*(double *)((long)pdVar1 + lVar7);
      pfVar4 = pfVar4 + 1;
      lVar7 = lVar7 + 8;
    } while (__n * 8 != lVar7);
  }
  if (*(long *)(grid + 8) == 0) {
    lVar7 = 0;
  }
  else {
    lVar7 = (long)*(int *)(*(long *)(grid + 8) + 0x14);
  }
  local_a8 = local_68.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  local_b0 = local_68.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start;
  std::vector<float,_std::allocator<float>_>::vector(&local_68,lVar7 * (long)local_a0,&local_b1);
  local_98.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = local_68.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start;
  local_98.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = local_68.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_finish;
  local_98.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       local_68.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
       _M_end_of_storage;
  lVar7 = *(long *)(grid + 8);
  if (lVar7 == 0) {
    lVar8 = 0;
  }
  else {
    lVar8 = (long)*(int *)(lVar7 + 0x10);
  }
  if (0 < numx) {
    uVar6 = (ulong)(uint)numx;
    pfVar5 = local_b0;
    do {
      TasGrid::TasmanianSparseGrid::evaluateBatch((float *)grid,(int)pfVar5,(float *)0x1);
      pfVar5 = pfVar5 + lVar8;
      uVar6 = uVar6 - 1;
    } while (uVar6 != 0);
    lVar7 = *(long *)(grid + 8);
  }
  pfVar4 = local_a8;
  pfVar5 = local_b0;
  if (lVar7 == 0) {
    lVar7 = 0;
  }
  else {
    lVar7 = (long)*(int *)(lVar7 + 0x14);
  }
  local_a0 = err1<std::vector<float,std::allocator<float>>,std::vector<double,std::allocator<double>>>
                       (lVar7 * (long)local_a0,&local_98,local_80);
  pcVar2 = (local_70->_M_dataplus)._M_p;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,pcVar2,pcVar2 + local_70->_M_string_length);
  bVar3 = testPass(local_a0,local_78,&local_50,grid);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if (pfVar5 != (float *)0x0) {
    operator_delete(pfVar5,(long)pfVar4 - (long)pfVar5);
  }
  if (local_98.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (float *)0x0) {
    operator_delete(local_98.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_98.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_98.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return bVar3;
}

Assistant:

bool testAccEval(std::vector<double> const &x, std::vector<double> const &y, int numx, double tolerance, TasmanianSparseGrid &grid, std::string message){
    std::vector<T> test_y, temp_x;
    std::vector<T> const &test_x = getVector(x, temp_x, Utils::size_mult(grid.getNumDimensions(), numx));

    if (std::is_same<EvalMethod, GridMethodBatch>::value){
        grid.evaluateBatch(test_x, test_y);
    }else if (std::is_same<EvalMethod, GridMethodFast>::value){
        test_y = std::vector<T>(Utils::size_mult(numx, grid.getNumOutputs()));
        Utils::Wrapper2D<T const> wx(grid.getNumDimensions(), test_x.data());
        Utils::Wrapper2D<T> wy(grid.getNumOutputs(), test_y.data());
        for(int i=0; i<numx; i++)
            grid.evaluateFast(wx.getStrip(i), wy.getStrip(i));
    }
    return testPass(err1(Utils::size_mult(numx, grid.getNumOutputs()), test_y, y), tolerance, message, grid);
}